

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_extend_rom.hpp
# Opt level: O2

void PatchExtendROM::add_bankswitching_when_writing_save(ROM *rom)

{
  uint32_t address;
  Code *pCVar1;
  allocator<char> local_149;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined2 local_130;
  undefined1 local_12e;
  AddressInRegister ret;
  _Rb_tree_node_base local_108;
  size_t local_e8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_e0;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)0x200a130f1;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::moveb(&func,'\x01',&ret.super_Param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"loop",(allocator<char> *)local_148);
  md::Code::label(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246d28;
  ret._reg.super_Register._code = '\x02';
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  ret._offset = 0;
  ret._m_without_offset = '\x03';
  local_148._0_8_ = &PTR_getXn_00246d28;
  local_138 = 0;
  local_148._8_8_ = &PTR_getXn_00246c60;
  local_130 = 0;
  local_12e = 2;
  md::Code::moveb(&func,&ret.super_Param,(Param *)local_148);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::addqw(&func,'\x02',(Register *)&ret);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,"loop",&local_149);
  md::Code::dbra(&func,(DataRegister *)local_148,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)0x200a130f1;
  md::Code::moveb(&func,'\0',&ret.super_Param);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,"",(allocator<char> *)local_148)
  ;
  address = md::ROM::inject_code(rom,&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  local_108._M_left = &local_108;
  _Stack_e0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8 = 0;
  _Stack_e0._0_8_ = 0;
  local_108._M_color = _S_red;
  local_108._4_4_ = 0;
  local_108._M_parent = (_Base_ptr)0x0;
  ret._reg.super_Register._code = '\0';
  ret._reg.super_Register._9_7_ = 0;
  ret._offset = 0;
  ret._m_without_offset = '\0';
  ret._27_5_ = 0;
  ret.super_Param._vptr_Param = (_func_int **)0x0;
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)0x0;
  _Stack_e0.super__Rb_tree_header._M_header._M_left = &_Stack_e0.super__Rb_tree_header._M_header;
  _Stack_e0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0.super__Rb_tree_header._M_node_count = 0;
  local_108._M_right = local_108._M_left;
  _Stack_e0.super__Rb_tree_header._M_header._M_right =
       _Stack_e0.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jsr((Code *)&ret,address);
  pCVar1 = md::Code::nop(pCVar1,1);
  md::ROM::set_code(rom,0x15ae,pCVar1);
  md::Code::~Code((Code *)&ret);
  md::Code::~Code(&func);
  return;
}

Assistant:

static void add_bankswitching_when_writing_save_checksum(md::ROM& rom)
    {
        md::Code proc;
        proc.moveb(BANK_SRAM, addr_(0xA130F1)); // switch to SRAM
        proc.moveb(reg_D1, addr_(reg_A0));
        proc.moveb(BANK_ROM, addr_(0xA130F1)); // switch to ROM
        proc.movem_from_stack({ reg_D0, reg_D1, reg_D7 }, { reg_A0, reg_A1, reg_A2 });
        proc.rts();

        uint32_t proc_write_checksum = rom.inject_code(proc);

        rom.set_code(0x15BA, md::Code().jmp(proc_write_checksum));
    }